

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

bool __thiscall World::PKExcept(World *this,int mapid)

{
  int iVar1;
  mapped_type *pmVar2;
  Map *pMVar3;
  long lVar4;
  _List_node_base *p_Var5;
  long *****ppppplVar6;
  long *****ppppplVar7;
  bool bVar8;
  list<int,_std::allocator<int>_> except_list;
  key_type local_b0;
  int local_8c;
  string local_88;
  key_type local_68;
  long ****local_48;
  long ****local_40;
  long local_38;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"JailMap","");
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->config,&local_b0);
  iVar1 = util::variant::GetInt(pmVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  bVar8 = true;
  if ((iVar1 != mapid) && (pMVar3 = GetMap(this,(short)mapid), pMVar3->arena == (Arena *)0x0)) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"PKExcept","");
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->config,&local_68);
    util::variant::GetString_abi_cxx11_(&local_88,pmVar2);
    local_38 = 0;
    local_8c = mapid;
    local_48 = (long ****)&local_48;
    local_40 = (long ****)&local_48;
    if ((local_88._M_string_length != 0) &&
       (local_88._M_dataplus._M_p[local_88._M_string_length - 1] != ',')) {
      std::__cxx11::string::push_back((char)&local_88);
    }
    lVar4 = std::__cxx11::string::find((char)&local_88,0x2c);
    if (lVar4 != -1) {
      do {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_88);
        iVar1 = util::to_int(&local_b0);
        p_Var5 = (_List_node_base *)operator_new(0x18);
        *(int *)&p_Var5[1]._M_next = iVar1;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        local_38 = local_38 + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        lVar4 = std::__cxx11::string::find((char)&local_88,0x2c);
      } while (lVar4 != -1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    iVar1 = local_8c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    ppppplVar6 = (long *****)local_48;
    if ((long *****)local_48 == &local_48) {
      bVar8 = false;
    }
    else {
      do {
        ppppplVar7 = ppppplVar6;
        if (*(int *)(ppppplVar6 + 2) == iVar1) break;
        ppppplVar6 = (long *****)*ppppplVar6;
        ppppplVar7 = &local_48;
      } while (ppppplVar6 != &local_48);
      bVar8 = ppppplVar7 != &local_48;
      ppppplVar6 = (long *****)local_48;
      do {
        ppppplVar7 = (long *****)*ppppplVar6;
        operator_delete(ppppplVar6,0x18);
        ppppplVar6 = ppppplVar7;
      } while (ppppplVar7 != &local_48);
    }
  }
  return bVar8;
}

Assistant:

bool World::PKExcept(int mapid)
{
	if (mapid == static_cast<int>(this->config["JailMap"]))
	{
		return true;
	}

	if (this->GetMap(mapid)->arena)
	{
		return true;
	}

	std::list<int> except_list = PKExceptUnserialize(this->config["PKExcept"]);

	return std::find(except_list.begin(), except_list.end(), mapid) != except_list.end();
}